

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_grammar_free(llama_sampler *smpl)

{
  long in_RDI;
  llama_sampler_grammar *ctx;
  llama_grammar *grammar;
  
  grammar = *(llama_grammar **)(in_RDI + 8);
  if (*(long *)&grammar->trigger_buffer != 0) {
    llama_grammar_free_impl(grammar);
  }
  if (grammar != (llama_grammar *)0x0) {
    llama_sampler_grammar::~llama_sampler_grammar((llama_sampler_grammar *)grammar);
    operator_delete(grammar,0x50);
  }
  return;
}

Assistant:

static void llama_sampler_grammar_free(struct llama_sampler * smpl) {
    const auto * ctx = (llama_sampler_grammar *) smpl->ctx;

    if (ctx->grammar) {
        llama_grammar_free_impl(ctx->grammar);
    }

    delete ctx;
}